

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

void chacha_block(mi_random_ctx_t *ctx)

{
  long in_RDI;
  size_t i_2;
  size_t i_1;
  size_t i;
  uint32_t x [16];
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  ulong uVar1;
  uint32_t *x_00;
  int local_48 [16];
  long local_8;
  
  for (x_00 = (uint32_t *)0x0; x_00 < (uint32_t *)0x10; x_00 = (uint32_t *)((long)x_00 + 1)) {
    local_48[(long)x_00] = *(int *)(in_RDI + (long)x_00 * 4);
  }
  local_8 = in_RDI;
  for (uVar1 = 0; uVar1 < 0x14; uVar1 = uVar1 + 2) {
    qround(x_00,uVar1,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0xace943);
    qround(x_00,uVar1,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0xace962);
    qround(x_00,uVar1,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0xace981);
    qround(x_00,uVar1,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0xace9a0);
    qround(x_00,uVar1,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0xace9be);
    qround(x_00,uVar1,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0xace9dd);
    qround(x_00,uVar1,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0xace9fc);
    qround(x_00,uVar1,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0xacea1b);
  }
  for (uVar1 = 0; uVar1 < 0x10; uVar1 = uVar1 + 1) {
    *(int *)(local_8 + 0x40 + uVar1 * 4) = local_48[uVar1] + *(int *)(local_8 + uVar1 * 4);
  }
  *(undefined4 *)(local_8 + 0x80) = 0x10;
  *(int *)(local_8 + 0x30) = *(int *)(local_8 + 0x30) + 1;
  if ((*(int *)(local_8 + 0x30) == 0) &&
     (*(int *)(local_8 + 0x34) = *(int *)(local_8 + 0x34) + 1, *(int *)(local_8 + 0x34) == 0)) {
    *(int *)(local_8 + 0x38) = *(int *)(local_8 + 0x38) + 1;
  }
  return;
}

Assistant:

static void chacha_block(mi_random_ctx_t* ctx)
{
  // scramble into `x`
  uint32_t x[16];
  for (size_t i = 0; i < 16; i++) {
    x[i] = ctx->input[i];
  }
  for (size_t i = 0; i < MI_CHACHA_ROUNDS; i += 2) {
    qround(x, 0, 4,  8, 12);
    qround(x, 1, 5,  9, 13);
    qround(x, 2, 6, 10, 14);
    qround(x, 3, 7, 11, 15);
    qround(x, 0, 5, 10, 15);
    qround(x, 1, 6, 11, 12);
    qround(x, 2, 7,  8, 13);
    qround(x, 3, 4,  9, 14);
  }

  // add scrambled data to the initial state
  for (size_t i = 0; i < 16; i++) {
    ctx->output[i] = x[i] + ctx->input[i];
  }
  ctx->output_available = 16;

  // increment the counter for the next round
  ctx->input[12] += 1;
  if (ctx->input[12] == 0) {
    ctx->input[13] += 1;
    if (ctx->input[13] == 0) {  // and keep increasing into the nonce
      ctx->input[14] += 1;
    }
  }
}